

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase
          (RaceSuccessfulPromiseNodeBase *this,
          Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *promises,
          ExceptionOrValue *output,SourceLocation location)

{
  size_t sVar1;
  ulong uVar2;
  Branch *pBVar3;
  ArrayDisposer *pAVar4;
  RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *pRVar5;
  Branch *pBVar6;
  ulong uVar7;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> result;
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> local_78;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *local_50;
  Branch *local_48;
  size_t local_40;
  ArrayDisposer *local_38;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0038b120;
  this->output = output;
  this->countLeft = (uint)promises->size_;
  (this->onReadyEvent).event = (Event *)0x0;
  this->armed = false;
  local_50 = &this->branches;
  (this->branches).ptr = (Branch *)0x0;
  (this->branches).size_ = 0;
  (this->branches).disposer = (ArrayDisposer *)0x0;
  sVar1 = promises->size_;
  local_78.ptr = (Branch *)
                 HeapArrayDisposer::allocateImpl
                           (0x50,0,sVar1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_78.endPtr = local_78.ptr + sVar1;
  local_78.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  uVar2 = promises->size_;
  local_78.pos = local_78.ptr;
  if (uVar2 != 0) {
    uVar7 = 0;
    do {
      ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::
      add<kj::_::RaceSuccessfulPromiseNodeBase&,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                (&local_78,this,promises->ptr + (uVar7 & 0xffffffff),&location);
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  local_40 = ((long)local_78.pos - (long)local_78.ptr >> 4) * -0x3333333333333333;
  local_48 = local_78.ptr;
  local_38 = local_78.disposer;
  local_78.ptr = (Branch *)0x0;
  local_78.pos = (RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)0x0;
  local_78.endPtr = (Branch *)0x0;
  pBVar3 = local_50->ptr;
  if (pBVar3 != (Branch *)0x0) {
    sVar1 = (this->branches).size_;
    local_50->ptr = (Branch *)0x0;
    local_50->size_ = 0;
    pAVar4 = (this->branches).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pBVar3,0x50,sVar1,sVar1,
               ArrayDisposer::Dispose_<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::destruct);
  }
  (this->branches).ptr = local_48;
  (this->branches).size_ = local_40;
  (this->branches).disposer = local_38;
  if (local_40 == 0) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  pBVar6 = local_78.endPtr;
  pRVar5 = local_78.pos;
  pBVar3 = local_78.ptr;
  if (local_78.ptr != (Branch *)0x0) {
    local_78.ptr = (Branch *)0x0;
    local_78.pos = (RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)0x0;
    local_78.endPtr = (Branch *)0x0;
    (*(code *)**(undefined8 **)local_78.disposer)
              (local_78.disposer,pBVar3,0x50,
               ((long)pRVar5 - (long)pBVar3 >> 4) * -0x3333333333333333,
               ((long)pBVar6 - (long)pBVar3 >> 4) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::destruct);
  }
  return;
}

Assistant:

RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase(
    Array<OwnPromiseNode> promises, ExceptionOrValue &output,
    SourceLocation location)
    : output(output), countLeft(promises.size()) {
  // Make the branches.
  auto builder = heapArrayBuilder<Branch>(promises.size());
  for (uint i : indices(promises)) {
    builder.add(*this, kj::mv(promises[i]), location);
  }
  branches = builder.finish();

  if (branches.size() == 0) {
    onReadyEvent.arm();
  }
}